

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O2

bool __thiscall TCPStream::waitForReadEvent(TCPStream *this,int timeout)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval tv;
  fd_set sdset;
  
  tv.tv_sec = (__time_t)timeout;
  tv.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    sdset.fds_bits[lVar2] = 0;
  }
  iVar1 = this->m_sd;
  sdset.fds_bits[iVar1 / 0x40] = sdset.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  iVar1 = select(iVar1 + 1,(fd_set *)&sdset,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
  return 0 < iVar1;
}

Assistant:

bool TCPStream::waitForReadEvent(int timeout)
{
    fd_set sdset;
    struct timeval tv;

    tv.tv_sec = timeout;
    tv.tv_usec = 0;
    FD_ZERO(&sdset);
    FD_SET(m_sd, &sdset);
    return select(m_sd + 1, &sdset, nullptr, nullptr, &tv) > 0;
}